

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_array.h
# Opt level: O2

void __thiscall
gtl::compact_array_base<int,_std::allocator<int>_>::set_size
          (compact_array_base<int,_std::allocator<int>_> *this,size_type_conflict n)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  S2LogMessage SStack_18;
  
  uVar1 = *(uint *)this;
  uVar2 = uVar1 >> 0x18 & 0x3f;
  uVar3 = 1 << ((byte)uVar2 & 0x1f);
  if ((uVar1 >> 0x1e & 1) == 0) {
    uVar3 = uVar2;
  }
  if (n <= uVar3) {
    *(uint *)this = uVar1 & 0xff000000 | n & 0xffffff;
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/compact_array.h"
             ,0x167,kFatal,(ostream *)&std::cerr);
  std::operator<<(SStack_18.stream_,"Check failed: (n) <= (capacity()) ");
  abort();
}

Assistant:

size_type capacity() const {
    return is_exponent_ ? (1 << capacity_) : capacity_;
  }